

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_UnknownExtensionsReflection_Test::
~UnknownFieldSetTest_UnknownExtensionsReflection_Test
          (UnknownFieldSetTest_UnknownExtensionsReflection_Test *this)

{
  UnknownFieldSetTest_UnknownExtensionsReflection_Test *this_local;
  
  ~UnknownFieldSetTest_UnknownExtensionsReflection_Test(this);
  operator_delete(this,0x398);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, UnknownExtensionsReflection) {
  // Same as UnknownExtensions except parsing via reflection.

  unittest::TestEmptyMessageWithExtensions message;
  io::ArrayInputStream raw_input(all_fields_data_.data(),
                                 all_fields_data_.size());
  io::CodedInputStream input(&raw_input);
  ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &message));

  EXPECT_EQ(message.DebugString(), empty_message_.DebugString());
}